

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

UBool ucnv_outputOverflowFromUnicode
                (UConverter *cnv,char **target,char *targetLimit,int32_t **pOffsets,UErrorCode *err)

{
  char cVar1;
  int32_t *piVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  long lVar9;
  
  iVar5 = 0;
  if (pOffsets == (int32_t **)0x0) {
    piVar2 = (int32_t *)0x0;
  }
  else {
    piVar2 = *pOffsets;
  }
  puVar7 = (uint8_t *)*target;
  cVar1 = cnv->charErrorBufferLength;
  if ('\0' < cVar1) {
    iVar5 = (int)cVar1;
  }
  lVar6 = -1;
  puVar8 = cnv->charErrorBuffer;
  while( true ) {
    if (iVar5 + lVar6 == -1) {
      cnv->charErrorBufferLength = '\0';
      *target = (char *)puVar7;
      if (piVar2 != (int32_t *)0x0) {
        *pOffsets = piVar2;
      }
      return '\0';
    }
    if (puVar7 == (uint8_t *)targetLimit) break;
    *puVar7 = *puVar8;
    if (piVar2 == (int32_t *)0x0) {
      piVar2 = (int32_t *)0x0;
    }
    else {
      *piVar2 = -1;
      piVar2 = piVar2 + 1;
    }
    puVar7 = puVar7 + 1;
    lVar6 = lVar6 + -1;
    puVar8 = puVar8 + 1;
  }
  lVar3 = 0;
  do {
    lVar4 = lVar3 + 1;
    cnv->charErrorBuffer[lVar3] = puVar8[lVar3];
    lVar9 = lVar3 - lVar6;
    lVar3 = lVar4;
  } while (lVar9 < cVar1);
  cnv->charErrorBufferLength = (int8_t)lVar4;
  *target = (char *)puVar7;
  if (piVar2 != (int32_t *)0x0) {
    *pOffsets = piVar2;
  }
  *err = U_BUFFER_OVERFLOW_ERROR;
  return '\x01';
}

Assistant:

static UBool
ucnv_outputOverflowFromUnicode(UConverter *cnv,
                               char **target, const char *targetLimit,
                               int32_t **pOffsets,
                               UErrorCode *err) {
    int32_t *offsets;
    char *overflow, *t;
    int32_t i, length;

    t=*target;
    if(pOffsets!=NULL) {
        offsets=*pOffsets;
    } else {
        offsets=NULL;
    }

    overflow=(char *)cnv->charErrorBuffer;
    length=cnv->charErrorBufferLength;
    i=0;
    while(i<length) {
        if(t==targetLimit) {
            /* the overflow buffer contains too much, keep the rest */
            int32_t j=0;

            do {
                overflow[j++]=overflow[i++];
            } while(i<length);

            cnv->charErrorBufferLength=(int8_t)j;
            *target=t;
            if(offsets!=NULL) {
                *pOffsets=offsets;
            }
            *err=U_BUFFER_OVERFLOW_ERROR;
            return TRUE;
        }

        /* copy the overflow contents to the target */
        *t++=overflow[i++];
        if(offsets!=NULL) {
            *offsets++=-1; /* no source index available for old output */
        }
    }

    /* the overflow buffer is completely copied to the target */
    cnv->charErrorBufferLength=0;
    *target=t;
    if(offsets!=NULL) {
        *pOffsets=offsets;
    }
    return FALSE;
}